

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17b8f50::BlendA64MaskTest8B_d16_ExtremeValues_Test::TestBody
          (BlendA64MaskTest8B_d16_ExtremeValues_Test *this)

{
  uchar *puVar1;
  bool bVar2;
  long lVar3;
  int bsize;
  int block_size;
  
  for (lVar3 = 0x14020; lVar3 != 0x28020; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)this + lVar3 + -0x13fe8) = 0xff;
    (this->super_BlendA64MaskTest8B_d16).
    super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    .dst_ref_[lVar3 + -0x20] = 0xff;
    puVar1 = (this->super_BlendA64MaskTest8B_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
             .dst_ref_ + lVar3 * 2 + -0x38;
    puVar1[0] = 0xff;
    puVar1[1] = '?';
    (this->super_BlendA64MaskTest8B_d16).
    super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    .src0_[lVar3 + -0x1c] = 0x3fff;
  }
  for (lVar3 = 0x78050; lVar3 != 0x88050; lVar3 = lVar3 + 1) {
    (this->super_BlendA64MaskTest8B_d16).
    super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    .dst_ref_[lVar3 + -0x38] = '?';
  }
  block_size = 0;
  while( true ) {
    if (block_size == 0x16) {
      return;
    }
    bVar2 = testing::Test::HasFatalFailure();
    if (bVar2) break;
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
               *)this,block_size,1);
    block_size = block_size + 1;
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, ExtremeValues) {
  for (int i = 0; i < kBufSize; ++i) {
    dst_ref_[i] = 255;
    dst_tst_[i] = 255;

    src0_[i] = kSrcMaxBitsMask;
    src1_[i] = kSrcMaxBitsMask;
  }

  for (int i = 0; i < kMaxMaskSize; ++i) mask_[i] = AOM_BLEND_A64_MAX_ALPHA - 1;

  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize)
    RunTest(bsize, 1);
}